

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_lookup_test.h
# Opt level: O1

void __thiscall
phmap::priv::gtest_suite_LookupTest_::
EqualRange<phmap::parallel_node_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>_>
::TestBody(EqualRange<phmap::parallel_node_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>_>
           *this)

{
  internal iVar1;
  Inner *pIVar2;
  ctrl_t *pcVar3;
  long lVar4;
  pointer ppVar5;
  pointer ppVar6;
  pointer *__ptr;
  char *pcVar7;
  difference_type __n;
  AssertHelperData *pAVar8;
  difference_type __n_1;
  AssertionResult gtest_ar;
  vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  values;
  pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::iterator,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::iterator>
  r;
  TypeParam m;
  AssertHelper local_588;
  internal local_580 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_578;
  AssertHelper local_570;
  iterator local_568;
  vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  local_538;
  pair<const_phmap::priv::NonStandardLayout,_int> *local_518;
  pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::iterator,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::iterator>
  local_510;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  local_4b0;
  
  local_538.
  super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pair<const_phmap::priv::NonStandardLayout,_int> *)0x0
  ;
  local_538.
  super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pair<const_phmap::priv::NonStandardLayout,_int> *)0x0;
  local_538.
  super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  generate_n<std::back_insert_iterator<std::vector<std::pair<phmap::priv::NonStandardLayout_const,int>,std::allocator<std::pair<phmap::priv::NonStandardLayout_const,int>>>>,int,phmap::priv::hash_internal::Generator<std::pair<phmap::priv::NonStandardLayout_const,int>,void>>
            ();
  ppVar6 = local_538.
           super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = 0x40;
  do {
    *(undefined8 *)((long)local_4b0.sets_._M_elems + lVar4 + -0x30) = 0;
    *(undefined8 *)((long)local_4b0.sets_._M_elems + lVar4 + -0x28) = 0;
    *(undefined8 *)((long)local_4b0.sets_._M_elems + lVar4 + -0x40) = 0;
    *(undefined8 *)((long)local_4b0.sets_._M_elems + lVar4 + -0x38) = 0;
    *(undefined8 *)((long)local_4b0.sets_._M_elems + lVar4 + -0x18) = 0;
    *(long *)((long)local_4b0.sets_._M_elems + lVar4 + -0x10) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
    next_id<phmap::priv::StatefulTestingEqual>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId + 1;
    *(long *)((long)local_4b0.sets_._M_elems + lVar4 + -8) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
    next_id<phmap::priv::StatefulTestingHash>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId + 1;
    *(undefined8 *)((long)&local_4b0.sets_._M_elems[0].set_.ctrl_ + lVar4) = 0;
    lVar4 = lVar4 + 0x48;
  } while (lVar4 != 0x4c0);
  if (local_538.
      super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_538.
      super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppVar5 = local_538.
             super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
      ::equal_range<phmap::priv::NonStandardLayout>(&local_510,&local_4b0,&ppVar5->first);
      pcVar3 = local_510.second.it_.ctrl_;
      pIVar2 = local_510.second.inner_;
      local_570.data_._0_4_ = 0;
      local_568.it_end_.ctrl_ = local_510.first.it_end_.ctrl_;
      local_568.it_end_.field_1 = local_510.first.it_end_.field_1;
      local_568.it_.ctrl_ = local_510.first.it_.ctrl_;
      local_568.it_.field_1 = local_510.first.it_.field_1;
      local_568.inner_ = local_510.first.inner_;
      local_568.inner_end_ = local_510.first.inner_end_;
      pAVar8 = (AssertHelperData *)0x0;
      while ((local_568.inner_ != pIVar2 ||
             ((local_568.inner_ != (Inner *)0x0 && (local_568.it_.ctrl_ != pcVar3))))) {
        parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
        ::iterator::operator++(&local_568);
        pAVar8 = (AssertHelperData *)((long)&pAVar8->type + 1);
      }
      local_588.data_ = pAVar8;
      testing::internal::CmpHelperEQ<int,long>
                (local_580,"0","std::distance(r.first, r.second)",(int *)&local_570,
                 (long *)&local_588);
      if (local_580[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_568);
        if (local_578 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = (local_578->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_588,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_lookup_test.h"
                   ,0x6b,pcVar7);
        testing::internal::AssertHelper::operator=(&local_588,(Message *)&local_568);
        goto LAB_002037e9;
      }
      if (local_578 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_578,local_578);
      }
      ppVar5 = ppVar5 + 1;
    } while (ppVar5 != ppVar6);
  }
  ppVar6 = local_538.
           super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_538.
      super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_538.
      super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppVar5 = local_538.
             super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
      ::emplace<const_std::pair<const_phmap::priv::NonStandardLayout,_int>_&,_0>
                ((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::iterator,_bool>
                  *)&local_510,&local_4b0,ppVar5);
      ppVar5 = ppVar5 + 1;
    } while (ppVar5 != ppVar6);
  }
  local_518 = local_538.
              super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_538.
      super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_538.
      super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppVar6 = local_538.
             super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
      ::equal_range<phmap::priv::NonStandardLayout>(&local_510,&local_4b0,&ppVar6->first);
      pcVar3 = local_510.second.it_.ctrl_;
      pIVar2 = local_510.second.inner_;
      local_570.data_._0_4_ = 1;
      local_568.it_end_.ctrl_ = local_510.first.it_end_.ctrl_;
      local_568.it_end_.field_1 = local_510.first.it_end_.field_1;
      local_568.it_.ctrl_ = local_510.first.it_.ctrl_;
      local_568.it_.field_1.slot_ = local_510.first.it_.field_1.slot_;
      local_568.inner_ = local_510.first.inner_;
      local_568.inner_end_ = local_510.first.inner_end_;
      pAVar8 = (AssertHelperData *)0x0;
      while ((local_568.inner_ != pIVar2 ||
             ((local_568.inner_ != (Inner *)0x0 && (local_568.it_.ctrl_ != pcVar3))))) {
        parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
        ::iterator::operator++(&local_568);
        pAVar8 = (AssertHelperData *)((long)&pAVar8->type + 1);
      }
      local_588.data_ = pAVar8;
      testing::internal::CmpHelperEQ<int,long>
                (local_580,"1","std::distance(r.first, r.second)",(int *)&local_570,
                 (long *)&local_588);
      iVar1 = local_580[0];
      if (local_580[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_568);
        if (local_578 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = (local_578->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_588,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_lookup_test.h"
                   ,0x70,pcVar7);
        testing::internal::AssertHelper::operator=(&local_588,(Message *)&local_568);
LAB_002037e9:
        testing::internal::AssertHelper::~AssertHelper(&local_588);
        if (local_568.inner_ != (Inner *)0x0) {
          (**(code **)(((local_568.inner_)->set_).ctrl_ + 8))();
        }
        if (local_578 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_578,local_578);
        }
        break;
      }
      if (local_578 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_578,local_578);
      }
      testing::internal::CmpHelperEQ<int,int>
                (local_580,"p.second","get<1>(*r.first)",&ppVar6->second,
                 &(*local_510.first.it_.field_1.slot_)->second);
      if (local_580[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_588);
        testing::PrintToString<phmap::priv::NonStandardLayout>((string *)&local_568,&ppVar6->first);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(local_588.data_)->line,(char *)local_568.inner_,
                   (long)local_568.inner_end_);
        pcVar7 = "";
        if (local_578 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = (local_578->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_570,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_lookup_test.h"
                   ,0x71,pcVar7);
        testing::internal::AssertHelper::operator=(&local_570,(Message *)&local_588);
        testing::internal::AssertHelper::~AssertHelper(&local_570);
        if ((EmbeddedIterator *)local_568.inner_ != &local_568.it_) {
          operator_delete(local_568.inner_,(ulong)(local_568.it_.ctrl_ + 1));
        }
        if (local_588.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_588.data_ + 8))();
        }
      }
      if (local_578 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_578,local_578);
      }
    } while ((iVar1 != (internal)0x0) && (ppVar6 = ppVar6 + 1, ppVar6 != local_518));
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::~parallel_hash_set(&local_4b0);
  std::
  vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::~vector(&local_538);
  return;
}

Assistant:

TYPED_TEST_P(LookupTest, EqualRange) {
  using std::get;
  using T = hash_internal::GeneratedType<TypeParam>;
  std::vector<T> values;
  std::generate_n(std::back_inserter(values), 10,
                  hash_internal::Generator<T>());
  TypeParam m;
  for (const auto& p : values) {
    auto r = m.equal_range(p.first);
    ASSERT_EQ(0, std::distance(r.first, r.second));
  }
  m.insert(values.begin(), values.end());
  for (const auto& p : values) {
    auto r = m.equal_range(p.first);
    ASSERT_EQ(1, std::distance(r.first, r.second));
    EXPECT_EQ(p.second, get<1>(*r.first)) << ::testing::PrintToString(p.first);
  }
}